

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cc
# Opt level: O2

void __thiscall kratos::Generator::add_port_name(Generator *this,string *port_name)

{
  iterator iVar1;
  VarException *this_00;
  mapped_type *pmVar2;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  basic_string_view<char> bVar3;
  string_view format_str;
  format_args args;
  initializer_list<const_kratos::IRNode_*> __l;
  string local_70;
  element_type *local_50;
  vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_> local_48;
  size_type sStack_30;
  allocator_type local_21;
  
  iVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::find(&(this->ports_)._M_t,port_name);
  if ((_Rb_tree_header *)iVar1._M_node == &(this->ports_)._M_t._M_impl.super__Rb_tree_header) {
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_emplace_unique<std::__cxx11::string_const&>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)&this->ports_,port_name);
    return;
  }
  this_00 = (VarException *)__cxa_allocate_exception(0x10);
  local_48.super__Vector_base<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)(port_name->_M_dataplus)._M_p;
  local_48.super__Vector_base<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)port_name->_M_string_length;
  local_48.super__Vector_base<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)(this->name)._M_dataplus._M_p;
  sStack_30 = (this->name)._M_string_length;
  bVar3 = fmt::v7::to_string_view<char,_0>("{0} already exists in {1}");
  format_str.data_ = (char *)bVar3.size_;
  format_str.size_ = 0xdd;
  args.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .field_1.args_ = in_R9.args_;
  args.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .desc_ = (unsigned_long_long)&local_48;
  fmt::v7::detail::vformat_abi_cxx11_(&local_70,(detail *)bVar3.data_,format_str,args);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>_>_>_>
           ::at(&this->vars_,port_name);
  local_50 = (pmVar2->super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  __l._M_len = 1;
  __l._M_array = (iterator)&local_50;
  std::vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>::vector
            (&local_48,__l,&local_21);
  VarException::VarException(this_00,&local_70,&local_48);
  __cxa_throw(this_00,&VarException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void Generator::add_port_name(const std::string &port_name) {
    if (ports_.find(port_name) != ports_.end())
        throw VarException(::format("{0} already exists in {1}", port_name, name),
                           {vars_.at(port_name).get()});
    ports_.emplace(port_name);
}